

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Ptr_AbcDeriveBoxes(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  pVVar3 = pNtk->vBoxes;
  iVar6 = pVVar3->nSize;
  uVar5 = pNtk->nObjCounts[7] + iVar6;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nSize = 0;
  pVVar1->nCap = uVar5;
  uVar9 = 0;
  if (uVar5 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((ulong)uVar5 << 3);
  }
  pVVar1->pArray = ppvVar2;
  if (0 < iVar6) {
    uVar10 = 0;
    do {
      pVVar3 = Ptr_AbcDeriveBox((Abc_Obj_t *)pVVar3->pArray[uVar10]);
      iVar6 = (int)uVar7;
      if ((int)uVar10 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,uVar7 * 8);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar2 = pVVar1->pArray;
      }
      uVar9 = uVar10 + 1;
      pVVar1->nSize = (int)uVar9;
      ppvVar2[uVar10] = pVVar3;
      pVVar3 = pNtk->vBoxes;
      uVar10 = uVar9;
    } while ((long)uVar9 < (long)pVVar3->nSize);
  }
  iVar8 = (int)uVar9;
  iVar6 = (int)uVar7;
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar4];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        pVVar3 = Ptr_AbcDeriveNode(pObj);
        iVar8 = (int)uVar9;
        iVar6 = (int)uVar7;
        if (iVar8 == iVar6) {
          if (iVar6 < 0x10) {
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
            }
            pVVar1->pArray = ppvVar2;
            pVVar1->nCap = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uint)(iVar6 * 2);
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(uVar7 * 8);
            }
            else {
              ppvVar2 = (void **)realloc(pVVar1->pArray,uVar7 * 8);
            }
            pVVar1->pArray = ppvVar2;
            pVVar1->nCap = iVar6 * 2;
          }
        }
        else {
          ppvVar2 = pVVar1->pArray;
        }
        pVVar1->nSize = iVar8 + 1U;
        ppvVar2[iVar8] = pVVar3;
        pVVar3 = pNtk->vObjs;
        uVar9 = (ulong)(iVar8 + 1U);
      }
      iVar8 = (int)uVar9;
      iVar6 = (int)uVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  if (iVar8 == iVar6) {
    return pVVar1;
  }
  __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Abc_NtkBoxNum(pNtk) + Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveBox(pObj) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveNode(pObj) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}